

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgTypes.cpp
# Opt level: O2

void GetMinMax(dgBigVector *minOut,dgBigVector *maxOut,HaF64 *vertexArray,HaI32 vCount,
              HaI32 strideInBytes)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  HaF64 *pHVar7;
  int iVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  dgBigVector local_50;
  
  iVar9 = strideInBytes >> 3;
  if (2 < iVar9) {
    dgBigVector::dgBigVector(&local_50,*vertexArray,vertexArray[1],vertexArray[2],0.0);
    (minOut->super_dgTemplateVector<double>).m_x = local_50.super_dgTemplateVector<double>.m_x;
    (minOut->super_dgTemplateVector<double>).m_y = local_50.super_dgTemplateVector<double>.m_y;
    (minOut->super_dgTemplateVector<double>).m_z = local_50.super_dgTemplateVector<double>.m_z;
    (minOut->super_dgTemplateVector<double>).m_w = local_50.super_dgTemplateVector<double>.m_w;
    dgBigVector::dgBigVector(&local_50,*vertexArray,vertexArray[1],vertexArray[2],0.0);
    pHVar7 = vertexArray + (long)iVar9 + 2;
    (maxOut->super_dgTemplateVector<double>).m_x = local_50.super_dgTemplateVector<double>.m_x;
    (maxOut->super_dgTemplateVector<double>).m_y = local_50.super_dgTemplateVector<double>.m_y;
    (maxOut->super_dgTemplateVector<double>).m_z = local_50.super_dgTemplateVector<double>.m_z;
    (maxOut->super_dgTemplateVector<double>).m_w = local_50.super_dgTemplateVector<double>.m_w;
    iVar8 = 1;
    while (iVar8 < vCount) {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = pHVar7[-2];
      iVar8 = iVar8 + 1;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (minOut->super_dgTemplateVector<double>).m_x;
      auVar1 = vminsd_avx(auVar10,auVar1);
      (minOut->super_dgTemplateVector<double>).m_x = auVar1._0_8_;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = pHVar7[-1];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (minOut->super_dgTemplateVector<double>).m_y;
      auVar1 = vminsd_avx(auVar11,auVar2);
      (minOut->super_dgTemplateVector<double>).m_y = auVar1._0_8_;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = *pHVar7;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (minOut->super_dgTemplateVector<double>).m_z;
      auVar1 = vminsd_avx(auVar12,auVar3);
      (minOut->super_dgTemplateVector<double>).m_z = auVar1._0_8_;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = pHVar7[-2];
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (maxOut->super_dgTemplateVector<double>).m_x;
      auVar1 = vmaxsd_avx(auVar13,auVar4);
      (maxOut->super_dgTemplateVector<double>).m_x = auVar1._0_8_;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = pHVar7[-1];
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (maxOut->super_dgTemplateVector<double>).m_y;
      auVar1 = vmaxsd_avx(auVar14,auVar5);
      (maxOut->super_dgTemplateVector<double>).m_y = auVar1._0_8_;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = *pHVar7;
      pHVar7 = pHVar7 + iVar9;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (maxOut->super_dgTemplateVector<double>).m_z;
      auVar1 = vmaxsd_avx(auVar15,auVar6);
      (maxOut->super_dgTemplateVector<double>).m_z = auVar1._0_8_;
    }
    return;
  }
  __assert_fail("stride >= 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgTypes.cpp"
                ,0x38,
                "void GetMinMax(dgBigVector &, dgBigVector &, const hacd::HaF64 *const, hacd::HaI32, hacd::HaI32)"
               );
}

Assistant:

void GetMinMax (dgBigVector &minOut, dgBigVector &maxOut, const hacd::HaF64* const vertexArray, hacd::HaI32 vCount, hacd::HaI32 strideInBytes)
{
	hacd::HaI32 stride = hacd::HaI32 (strideInBytes / sizeof (hacd::HaF64));
	const hacd::HaF64* vArray = vertexArray + stride;

	HACD_ASSERT (stride >= 3);
	minOut = dgBigVector (vertexArray[0], vertexArray[1], vertexArray[2], hacd::HaF64 (0.0f)); 
	maxOut = dgBigVector (vertexArray[0], vertexArray[1], vertexArray[2], hacd::HaF64 (0.0f)); 

	for (hacd::HaI32 i = 1; i < vCount; i ++) {
		minOut.m_x = GetMin (minOut.m_x, vArray[0]);
		minOut.m_y = GetMin (minOut.m_y, vArray[1]);
		minOut.m_z = GetMin (minOut.m_z, vArray[2]);

		maxOut.m_x = GetMax (maxOut.m_x, vArray[0]);
		maxOut.m_y = GetMax (maxOut.m_y, vArray[1]);
		maxOut.m_z = GetMax (maxOut.m_z, vArray[2]);

		vArray += stride;
	}
}